

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excitation_generation.cc
# Opt level: O3

bool __thiscall
sptk::ExcitationGeneration::Get
          (ExcitationGeneration *this,double *excitation,double *pulse,double *noise,double *pitch)

{
  double __x;
  double dVar1;
  RandomGenerationInterface *pRVar2;
  int iVar3;
  double noise_in_current_point;
  double *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (this->is_valid_ == true) {
    local_48 = (double *)0x0;
    uStack_40 = 0;
    local_38 = 0;
    iVar3 = (*(this->input_source_->super_InputSourceInterface)._vptr_InputSourceInterface[4])();
    if ((char)iVar3 == '\0') {
      if (local_48 != (double *)0x0) {
        operator_delete(local_48);
      }
    }
    else {
      __x = *local_48;
      operator_delete(local_48);
      if (0.0 <= __x) {
        local_48 = (double *)0x0;
        pRVar2 = this->random_generation_;
        if ((pRVar2 == (RandomGenerationInterface *)0x0) ||
           (iVar3 = (*pRVar2->_vptr_RandomGenerationInterface[3])(pRVar2,&local_48),
           (char)iVar3 != '\0')) {
          if (pitch != (double *)0x0) {
            *pitch = __x;
          }
          if (noise != (double *)0x0) {
            *noise = (double)local_48;
          }
          dVar1 = this->input_source_->magic_number_;
          if ((dVar1 == __x) && (!NAN(dVar1) && !NAN(__x))) {
            this->phase_ = 1.0;
            if (excitation != (double *)0x0) {
              *excitation = (double)local_48;
            }
            if (pulse == (double *)0x0) {
              return true;
            }
            *pulse = 0.0;
            return true;
          }
          dVar1 = 0.0;
          if (1.0 <= this->phase_) {
            this->phase_ = this->phase_ + -1.0;
            if (__x < 0.0) {
              dVar1 = sqrt(__x);
            }
            else {
              dVar1 = SQRT(__x);
            }
          }
          if (excitation != (double *)0x0) {
            *excitation = dVar1;
          }
          if (pulse != (double *)0x0) {
            *pulse = dVar1;
          }
          this->phase_ = 1.0 / __x + this->phase_;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ExcitationGeneration::Get(double* excitation, double* pulse, double* noise,
                               double* pitch) {
  if (!is_valid_) {
    return false;
  }

  // Get pitch.
  double pitch_in_current_point;
  {
    std::vector<double> tmp;
    if (!input_source_->Get(&tmp) || tmp[0] < 0.0) {
      return false;
    }
    pitch_in_current_point = tmp[0];
  }

  // Get noise.
  double noise_in_current_point(0.0);
  if (random_generation_ && !random_generation_->Get(&noise_in_current_point)) {
    return false;
  }

  if (pitch) {
    *pitch = pitch_in_current_point;
  }
  if (noise) {
    *noise = noise_in_current_point;
  }

  // If unvoiced point, return white noise.
  if (input_source_->GetMagicNumber() == pitch_in_current_point) {
    phase_ = 1.0;
    if (excitation) {
      *excitation = noise_in_current_point;
    }
    if (pulse) {
      *pulse = 0.0;
    }
    return true;
  }

  // If voiced point, return pulse or zero.
  double pulse_in_current_point;
  if (1.0 <= phase_) {
    phase_ -= 1.0;
    pulse_in_current_point = std::sqrt(pitch_in_current_point);
  } else {
    pulse_in_current_point = 0.0;
  }

  if (excitation) {
    *excitation = pulse_in_current_point;
  }
  if (pulse) {
    *pulse = pulse_in_current_point;
  }

  // Proceed phase.
  phase_ += 1.0 / pitch_in_current_point;

  return true;
}